

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<double> * __thiscall
Imath_3_2::Matrix33<double>::operator*(Matrix33<double> *this,Matrix33<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Matrix33<double> *tmp;
  Matrix33<double> *in_RDI;
  
  dVar7 = this->x[0][0];
  dVar8 = this->x[0][1];
  dVar9 = this->x[0][2];
  dVar10 = v->x[0][0];
  dVar11 = v->x[0][1];
  dVar12 = v->x[1][0];
  dVar13 = v->x[1][1];
  dVar14 = v->x[2][0];
  dVar15 = v->x[2][1];
  in_RDI->x[0][0] = dVar9 * dVar14 + dVar7 * dVar10 + dVar8 * dVar12;
  in_RDI->x[0][1] = dVar9 * dVar15 + dVar7 * dVar11 + dVar8 * dVar13;
  dVar1 = v->x[0][2];
  dVar2 = v->x[1][2];
  dVar3 = v->x[2][2];
  dVar4 = this->x[1][0];
  dVar5 = this->x[1][1];
  dVar6 = this->x[1][2];
  in_RDI->x[0][2] = dVar3 * dVar9 + dVar1 * dVar7 + dVar8 * dVar2;
  in_RDI->x[1][0] = dVar14 * dVar6 + dVar10 * dVar4 + dVar5 * dVar12;
  in_RDI->x[1][1] = dVar15 * dVar6 + dVar11 * dVar4 + dVar5 * dVar13;
  in_RDI->x[1][2] = dVar3 * dVar6 + dVar1 * dVar4 + dVar5 * dVar2;
  dVar4 = this->x[2][0];
  dVar5 = this->x[2][1];
  dVar6 = this->x[2][2];
  in_RDI->x[2][0] = dVar6 * dVar14 + dVar4 * dVar10 + dVar5 * dVar12;
  in_RDI->x[2][1] = dVar6 * dVar15 + dVar4 * dVar11 + dVar5 * dVar13;
  in_RDI->x[2][2] = dVar6 * dVar3 + dVar4 * dVar1 + dVar2 * dVar5;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>
Matrix33<T>::operator* (const Matrix33<T>& v) const IMATH_NOEXCEPT
{
    // Avoid initializing with 0 values before immediately overwriting them,
    // and unroll all loops for the best autovectorization.
    Matrix33 tmp (IMATH_INTERNAL_NAMESPACE::UNINITIALIZED);

    tmp.x[0][0] =
        x[0][0] * v.x[0][0] + x[0][1] * v.x[1][0] + x[0][2] * v.x[2][0];
    tmp.x[0][1] =
        x[0][0] * v.x[0][1] + x[0][1] * v.x[1][1] + x[0][2] * v.x[2][1];
    tmp.x[0][2] =
        x[0][0] * v.x[0][2] + x[0][1] * v.x[1][2] + x[0][2] * v.x[2][2];

    tmp.x[1][0] =
        x[1][0] * v.x[0][0] + x[1][1] * v.x[1][0] + x[1][2] * v.x[2][0];
    tmp.x[1][1] =
        x[1][0] * v.x[0][1] + x[1][1] * v.x[1][1] + x[1][2] * v.x[2][1];
    tmp.x[1][2] =
        x[1][0] * v.x[0][2] + x[1][1] * v.x[1][2] + x[1][2] * v.x[2][2];

    tmp.x[2][0] =
        x[2][0] * v.x[0][0] + x[2][1] * v.x[1][0] + x[2][2] * v.x[2][0];
    tmp.x[2][1] =
        x[2][0] * v.x[0][1] + x[2][1] * v.x[1][1] + x[2][2] * v.x[2][1];
    tmp.x[2][2] =
        x[2][0] * v.x[0][2] + x[2][1] * v.x[1][2] + x[2][2] * v.x[2][2];

    return tmp;
}